

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O2

void __thiscall HEkkDualRHS::createInfeasList(HEkkDualRHS *this,double columnDensity)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double *__first;
  HEkk *pHVar4;
  pointer pcVar5;
  pointer pdVar6;
  pointer piVar7;
  HighsInt iRow_1;
  ulong uVar8;
  HighsInt i;
  HighsInt iRow;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar1 = (this->ekk_instance_->lp_).num_row_;
  __first = (this->ekk_instance_->scattered_dual_edge_weight_).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  std::__fill_n_a<char*,int,int>();
  this->workCount = 0;
  this->workCutoff = 0.0;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    dVar13 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = '\x01';
      iVar2 = this->workCount;
      this->workCount = iVar2 + 1;
      (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = (int)uVar8;
    }
  }
  iVar2 = this->workCount;
  dVar13 = (double)iVar2;
  if (columnDensity < 0.05) {
    dVar14 = (double)(int)uVar1 * 0.01;
    dVar12 = 500.0;
    if (500.0 <= dVar14) {
      dVar12 = dVar14;
    }
    if (dVar12 < dVar13) {
      pHVar4 = this->ekk_instance_;
      dVar12 = 500.0;
      if (500.0 <= dVar13 * 0.001) {
        dVar12 = dVar13 * 0.001;
      }
      pcVar5 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar9 = 0;
      dVar13 = 0.0;
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        dVar14 = dVar13;
        if (pcVar5[uVar8] != '\0') {
          dVar15 = pdVar6[uVar8] /
                   (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8];
          dVar14 = dVar15;
          if (dVar15 <= dVar13) {
            dVar14 = dVar13;
          }
          lVar10 = (long)iVar9;
          iVar9 = iVar9 + 1;
          __first[lVar10] = -dVar15;
        }
        dVar13 = dVar14;
      }
      iVar9 = (int)dVar12;
      lVar10 = (long)iVar9;
      std::nth_element<double*>(__first,__first + lVar10,__first + iVar2);
      dVar12 = __first[lVar10];
      dVar14 = dVar12 * -1.00001;
      if (dVar13 * 0.99999 <= dVar14) {
        dVar14 = dVar13 * 0.99999;
      }
      this->workCutoff = dVar14;
      std::__fill_n_a<char*,int,int>
                ((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,uVar1);
      this->workCount = 0;
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        if ((pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] * this->workCutoff <=
            (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8]) {
          iVar2 = this->workCount;
          this->workCount = iVar2 + 1;
          (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2] = (int)uVar8;
          (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = '\x01';
        }
      }
      iVar2 = this->workCount;
      dVar13 = (double)iVar2;
      if ((double)iVar9 * 1.5 < dVar13) {
        this->workCount = iVar9;
        for (; lVar10 < iVar2; lVar10 = lVar10 + 1) {
          piVar7 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar9 = piVar7[lVar10];
          if ((this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar9] <=
              (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar9] * -dVar12) {
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9] = '\0';
          }
          else {
            iVar3 = this->workCount;
            this->workCount = iVar3 + 1;
            piVar7[iVar3] = iVar9;
          }
        }
        dVar13 = (double)this->workCount;
      }
    }
  }
  if ((double)(int)uVar1 * 0.2 < dVar13) {
    this->workCount = -uVar1;
    this->workCutoff = 0.0;
  }
  return;
}

Assistant:

void HEkkDualRHS::createInfeasList(double columnDensity) {
  HighsInt numRow = ekk_instance_.lp_.num_row_;
  double* dwork = ekk_instance_.scattered_dual_edge_weight_.data();

  // 1. Build the full list
  fill_n(workMark.data(), numRow, 0);
  workCount = 0;
  workCutoff = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (work_infeasibility[iRow]) {
      workMark[iRow] = 1;
      workIndex[workCount++] = iRow;
    }
  }

  // 2. See if it worth to try to go sparse
  //    (Many candidates, really sparse RHS)
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
    HighsInt icutoff = max(workCount * 0.001, 500.0);
    double maxMerit = 0;
    for (HighsInt iRow = 0, iPut = 0; iRow < numRow; iRow++)
      if (workMark[iRow]) {
        double myMerit = work_infeasibility[iRow] / edge_weight[iRow];
        if (maxMerit < myMerit) maxMerit = myMerit;
        dwork[iPut++] = -myMerit;
      }
    nth_element(dwork, dwork + icutoff, dwork + workCount);
    double cutMerit = -dwork[icutoff];
    workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

    // Create again
    fill_n(workMark.data(), numRow, 0);
    workCount = 0;
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      if (work_infeasibility[iRow] >= edge_weight[iRow] * workCutoff) {
        workIndex[workCount++] = iRow;
        workMark[iRow] = 1;
      }
    }

    // Reduce by drop smaller
    if (workCount > icutoff * 1.5) {
      // Firstly take up "icutoff" number of elements
      HighsInt fullCount = workCount;
      workCount = icutoff;
      for (HighsInt i = icutoff; i < fullCount; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > edge_weight[iRow] * cutMerit) {
          workIndex[workCount++] = iRow;
        } else {
          workMark[iRow] = 0;
        }
      }
    }
  }

  // 3. If there are still too many candidates: disable them
  if (workCount > 0.2 * numRow) {
    workCount = -numRow;
    workCutoff = 0;
  }
}